

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O0

float MatrixDeterminant(Matrix mat)

{
  float in_stack_00000008;
  float in_stack_0000000c;
  float result;
  float a33;
  float a32;
  float a31;
  float a30;
  float a23;
  float a22;
  float a21;
  float a20;
  float a13;
  float a12;
  float a11;
  float a10;
  float a03;
  float a02;
  float a01;
  float a00;
  
  return in_stack_00000008 * mat.m12 * mat.m2 * mat.m7 +
         -(in_stack_0000000c * mat.m8 * mat.m2) * mat.m7 +
         -(in_stack_00000008 * mat.m1 * mat.m13) * mat.m7 +
         mat.m0 * mat.m8 * mat.m13 * mat.m7 +
         in_stack_0000000c * mat.m1 * mat.m9 * mat.m7 +
         -(mat.m0 * mat.m12 * mat.m9) * mat.m7 +
         -(in_stack_00000008 * mat.m12 * mat.m6) * mat.m3 +
         in_stack_0000000c * mat.m8 * mat.m6 * mat.m3 +
         in_stack_00000008 * mat.m5 * mat.m13 * mat.m3 +
         -(mat.m4 * mat.m8 * mat.m13) * mat.m3 +
         -(in_stack_0000000c * mat.m5 * mat.m9) * mat.m3 +
         mat.m4 * mat.m12 * mat.m9 * mat.m3 +
         in_stack_00000008 * mat.m1 * mat.m6 * mat.m14 +
         -(mat.m0 * mat.m8 * mat.m6) * mat.m14 +
         -(in_stack_00000008 * mat.m5 * mat.m2) * mat.m14 +
         mat.m4 * mat.m8 * mat.m2 * mat.m14 +
         mat.m0 * mat.m5 * mat.m9 * mat.m14 +
         -(mat.m4 * mat.m1 * mat.m9) * mat.m14 +
         -(in_stack_0000000c * mat.m1 * mat.m6) * mat.m10 +
         mat.m0 * mat.m12 * mat.m6 * mat.m10 +
         in_stack_0000000c * mat.m5 * mat.m2 * mat.m10 +
         -(mat.m4 * mat.m12 * mat.m2) * mat.m10 +
         mat.m4 * mat.m1 * mat.m13 * mat.m10 + -(mat.m0 * mat.m5 * mat.m13 * mat.m10);
}

Assistant:

RMDEF float MatrixDeterminant(Matrix mat)
{
    // Cache the matrix values (speed optimization)
    float a00 = mat.m0, a01 = mat.m1, a02 = mat.m2, a03 = mat.m3;
    float a10 = mat.m4, a11 = mat.m5, a12 = mat.m6, a13 = mat.m7;
    float a20 = mat.m8, a21 = mat.m9, a22 = mat.m10, a23 = mat.m11;
    float a30 = mat.m12, a31 = mat.m13, a32 = mat.m14, a33 = mat.m15;

    float result = a30*a21*a12*a03 - a20*a31*a12*a03 - a30*a11*a22*a03 + a10*a31*a22*a03 +
                   a20*a11*a32*a03 - a10*a21*a32*a03 - a30*a21*a02*a13 + a20*a31*a02*a13 +
                   a30*a01*a22*a13 - a00*a31*a22*a13 - a20*a01*a32*a13 + a00*a21*a32*a13 +
                   a30*a11*a02*a23 - a10*a31*a02*a23 - a30*a01*a12*a23 + a00*a31*a12*a23 +
                   a10*a01*a32*a23 - a00*a11*a32*a23 - a20*a11*a02*a33 + a10*a21*a02*a33 +
                   a20*a01*a12*a33 - a00*a21*a12*a33 - a10*a01*a22*a33 + a00*a11*a22*a33;

    return result;
}